

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O0

void __thiscall libchars::edit_object::edit_object(edit_object *this,mode_e m,char *s)

{
  size_t sVar1;
  char *s_local;
  mode_e m_local;
  edit_object *this_local;
  
  this->_vptr_edit_object = (_func_int **)&PTR__edit_object_00106d10;
  this->mode = m;
  std::__cxx11::string::string((string *)&this->prompt);
  if (s == (char *)0x0) {
    memset(this->buffer,0,0x4000);
    this->buflen = 0;
  }
  else {
    strncpy(this->buffer,s,0x3fff);
    this->buffer[0x3fff] = '\0';
    sVar1 = strlen(this->buffer);
    this->buflen = sVar1;
  }
  reset(this);
  return;
}

Assistant:

edit_object(mode_e m = MODE_STRING, const char *s = NULL) : mode(m) {
            if (s != NULL) {
                strncpy(buffer,s,sizeof(buffer)-1);
                buffer[sizeof(buffer) - 1] = 0;
                buflen = strlen(buffer);
            }
            else {
                memset(buffer, 0, sizeof(buffer));
                buflen = 0;
            }
            reset();
        }